

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

void anon_unknown.dwarf_1ed46f2::sha256::TransformD64(uchar *out,uchar *in)

{
  long in_FS_OFFSET;
  uint32_t t7;
  uint32_t t6;
  uint32_t t5;
  uint32_t t4;
  uint32_t t3;
  uint32_t t2;
  uint32_t t1;
  uint32_t t0;
  uint32_t w15;
  uint32_t w14;
  uint32_t w13;
  uint32_t w12;
  uint32_t w11;
  uint32_t w10;
  uint32_t w9;
  uint32_t w8;
  uint32_t w7;
  uint32_t w6;
  uint32_t w5;
  uint32_t w4;
  uint32_t w3;
  uint32_t w2;
  uint32_t w1;
  uint32_t w0;
  uint32_t h;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t in_stack_fffffffffffff30c;
  uchar *in_stack_fffffffffffff310;
  uint32_t *puVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  uint32_t *ptr;
  int *ptr_00;
  uint32_t *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  uint32_t in_stack_fffffffffffff320;
  uint32_t in_stack_fffffffffffff324;
  undefined4 uVar5;
  undefined4 uVar6;
  uint32_t c_00;
  uint32_t b_00;
  uint32_t a_00;
  uint32_t in_stack_fffffffffffff350;
  uint32_t g_00;
  undefined4 in_stack_fffffffffffff358;
  int iVar7;
  undefined4 in_stack_fffffffffffff35c;
  int iVar8;
  uint32_t in_stack_fffffffffffff360;
  uint32_t k;
  uint32_t local_38;
  int local_34;
  int local_30;
  int local_2c;
  uint32_t local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = 0x6a09e667;
  local_20 = -0x4498517b;
  local_24 = 0x3c6ef372;
  local_28 = 0xa54ff53a;
  local_2c = 0x510e527f;
  local_30 = -0x64fa9774;
  local_34 = 0x1f83d9ab;
  local_38 = 0x5be0cd19;
  uVar6 = 0x6a09e667;
  c_00 = 0x3c6ef372;
  b_00 = 0x510e527f;
  a_00 = 0x9b05688c;
  uVar5 = 0x1f83d9ab;
  ReadBE32(in_stack_fffffffffffff310);
  ptr = &local_38;
  ptr_01 = &local_28;
  puVar1 = ptr;
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,in_stack_fffffffffffff350,
        (uint32_t *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
        in_stack_fffffffffffff360);
  g_00 = local_28;
  ReadBE32((uchar *)puVar1);
  ptr_00 = &local_34;
  ptr_02 = &local_24;
  piVar2 = ptr_00;
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,
        (uint32_t *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
        in_stack_fffffffffffff360);
  iVar7 = local_2c;
  iVar8 = local_34;
  k = local_38;
  ReadBE32((uchar *)piVar2);
  piVar2 = &local_30;
  ptr_03 = &local_20;
  piVar3 = piVar2;
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)piVar3);
  piVar3 = &local_2c;
  ptr_04 = &local_1c;
  piVar4 = piVar3;
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)piVar4);
  puVar1 = ptr_01;
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)puVar1);
  piVar4 = ptr_02;
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)piVar4);
  piVar4 = ptr_03;
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)piVar4);
  piVar4 = ptr_04;
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)piVar4);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)ptr);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)ptr_00);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)piVar2);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)piVar3);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)ptr_01);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)ptr_02);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  ReadBE32((uchar *)ptr_03);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  local_1c = local_1c + 0x6a09e667;
  local_20 = local_20 + -0x4498517b;
  local_24 = local_24 + 0x3c6ef372;
  local_28 = local_28 + 0xa54ff53a;
  local_2c = local_2c + 0x510e527f;
  local_30 = local_30 + -0x64fa9774;
  local_34 = local_34 + 0x1f83d9ab;
  local_38 = local_38 + 0x5be0cd19;
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  local_1c = 0x6a09e667;
  local_20 = -0x4498517b;
  local_24 = 0x3c6ef372;
  local_28 = 0xa54ff53a;
  local_2c = 0x510e527f;
  local_30 = -0x64fa9774;
  local_34 = 0x1f83d9ab;
  local_38 = 0x5be0cd19;
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  sigma1(in_stack_fffffffffffff30c);
  sigma0(in_stack_fffffffffffff30c);
  Round(a_00,b_00,c_00,(uint32_t *)CONCAT44(uVar6,uVar5),in_stack_fffffffffffff324,
        in_stack_fffffffffffff320,g_00,(uint32_t *)CONCAT44(iVar8,iVar7),k);
  WriteBE32((uchar *)ptr_04,in_stack_fffffffffffff30c);
  WriteBE32((uchar *)ptr_04,in_stack_fffffffffffff30c);
  WriteBE32((uchar *)ptr_04,in_stack_fffffffffffff30c);
  WriteBE32((uchar *)ptr_04,in_stack_fffffffffffff30c);
  WriteBE32((uchar *)ptr_04,in_stack_fffffffffffff30c);
  WriteBE32((uchar *)ptr_04,in_stack_fffffffffffff30c);
  WriteBE32((uchar *)ptr_04,in_stack_fffffffffffff30c);
  WriteBE32((uchar *)ptr_04,in_stack_fffffffffffff30c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TransformD64(unsigned char* out, const unsigned char* in)
{
    // Transform 1
    uint32_t a = 0x6a09e667ul;
    uint32_t b = 0xbb67ae85ul;
    uint32_t c = 0x3c6ef372ul;
    uint32_t d = 0xa54ff53aul;
    uint32_t e = 0x510e527ful;
    uint32_t f = 0x9b05688cul;
    uint32_t g = 0x1f83d9abul;
    uint32_t h = 0x5be0cd19ul;

    uint32_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f, g, h, 0x428a2f98ul + (w0 = ReadBE32(in + 0)));
    Round(h, a, b, c, d, e, f, g, 0x71374491ul + (w1 = ReadBE32(in + 4)));
    Round(g, h, a, b, c, d, e, f, 0xb5c0fbcful + (w2 = ReadBE32(in + 8)));
    Round(f, g, h, a, b, c, d, e, 0xe9b5dba5ul + (w3 = ReadBE32(in + 12)));
    Round(e, f, g, h, a, b, c, d, 0x3956c25bul + (w4 = ReadBE32(in + 16)));
    Round(d, e, f, g, h, a, b, c, 0x59f111f1ul + (w5 = ReadBE32(in + 20)));
    Round(c, d, e, f, g, h, a, b, 0x923f82a4ul + (w6 = ReadBE32(in + 24)));
    Round(b, c, d, e, f, g, h, a, 0xab1c5ed5ul + (w7 = ReadBE32(in + 28)));
    Round(a, b, c, d, e, f, g, h, 0xd807aa98ul + (w8 = ReadBE32(in + 32)));
    Round(h, a, b, c, d, e, f, g, 0x12835b01ul + (w9 = ReadBE32(in + 36)));
    Round(g, h, a, b, c, d, e, f, 0x243185beul + (w10 = ReadBE32(in + 40)));
    Round(f, g, h, a, b, c, d, e, 0x550c7dc3ul + (w11 = ReadBE32(in + 44)));
    Round(e, f, g, h, a, b, c, d, 0x72be5d74ul + (w12 = ReadBE32(in + 48)));
    Round(d, e, f, g, h, a, b, c, 0x80deb1feul + (w13 = ReadBE32(in + 52)));
    Round(c, d, e, f, g, h, a, b, 0x9bdc06a7ul + (w14 = ReadBE32(in + 56)));
    Round(b, c, d, e, f, g, h, a, 0xc19bf174ul + (w15 = ReadBE32(in + 60)));
    Round(a, b, c, d, e, f, g, h, 0xe49b69c1ul + (w0 += sigma1(w14) + w9 + sigma0(w1)));
    Round(h, a, b, c, d, e, f, g, 0xefbe4786ul + (w1 += sigma1(w15) + w10 + sigma0(w2)));
    Round(g, h, a, b, c, d, e, f, 0x0fc19dc6ul + (w2 += sigma1(w0) + w11 + sigma0(w3)));
    Round(f, g, h, a, b, c, d, e, 0x240ca1ccul + (w3 += sigma1(w1) + w12 + sigma0(w4)));
    Round(e, f, g, h, a, b, c, d, 0x2de92c6ful + (w4 += sigma1(w2) + w13 + sigma0(w5)));
    Round(d, e, f, g, h, a, b, c, 0x4a7484aaul + (w5 += sigma1(w3) + w14 + sigma0(w6)));
    Round(c, d, e, f, g, h, a, b, 0x5cb0a9dcul + (w6 += sigma1(w4) + w15 + sigma0(w7)));
    Round(b, c, d, e, f, g, h, a, 0x76f988daul + (w7 += sigma1(w5) + w0 + sigma0(w8)));
    Round(a, b, c, d, e, f, g, h, 0x983e5152ul + (w8 += sigma1(w6) + w1 + sigma0(w9)));
    Round(h, a, b, c, d, e, f, g, 0xa831c66dul + (w9 += sigma1(w7) + w2 + sigma0(w10)));
    Round(g, h, a, b, c, d, e, f, 0xb00327c8ul + (w10 += sigma1(w8) + w3 + sigma0(w11)));
    Round(f, g, h, a, b, c, d, e, 0xbf597fc7ul + (w11 += sigma1(w9) + w4 + sigma0(w12)));
    Round(e, f, g, h, a, b, c, d, 0xc6e00bf3ul + (w12 += sigma1(w10) + w5 + sigma0(w13)));
    Round(d, e, f, g, h, a, b, c, 0xd5a79147ul + (w13 += sigma1(w11) + w6 + sigma0(w14)));
    Round(c, d, e, f, g, h, a, b, 0x06ca6351ul + (w14 += sigma1(w12) + w7 + sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, 0x14292967ul + (w15 += sigma1(w13) + w8 + sigma0(w0)));
    Round(a, b, c, d, e, f, g, h, 0x27b70a85ul + (w0 += sigma1(w14) + w9 + sigma0(w1)));
    Round(h, a, b, c, d, e, f, g, 0x2e1b2138ul + (w1 += sigma1(w15) + w10 + sigma0(w2)));
    Round(g, h, a, b, c, d, e, f, 0x4d2c6dfcul + (w2 += sigma1(w0) + w11 + sigma0(w3)));
    Round(f, g, h, a, b, c, d, e, 0x53380d13ul + (w3 += sigma1(w1) + w12 + sigma0(w4)));
    Round(e, f, g, h, a, b, c, d, 0x650a7354ul + (w4 += sigma1(w2) + w13 + sigma0(w5)));
    Round(d, e, f, g, h, a, b, c, 0x766a0abbul + (w5 += sigma1(w3) + w14 + sigma0(w6)));
    Round(c, d, e, f, g, h, a, b, 0x81c2c92eul + (w6 += sigma1(w4) + w15 + sigma0(w7)));
    Round(b, c, d, e, f, g, h, a, 0x92722c85ul + (w7 += sigma1(w5) + w0 + sigma0(w8)));
    Round(a, b, c, d, e, f, g, h, 0xa2bfe8a1ul + (w8 += sigma1(w6) + w1 + sigma0(w9)));
    Round(h, a, b, c, d, e, f, g, 0xa81a664bul + (w9 += sigma1(w7) + w2 + sigma0(w10)));
    Round(g, h, a, b, c, d, e, f, 0xc24b8b70ul + (w10 += sigma1(w8) + w3 + sigma0(w11)));
    Round(f, g, h, a, b, c, d, e, 0xc76c51a3ul + (w11 += sigma1(w9) + w4 + sigma0(w12)));
    Round(e, f, g, h, a, b, c, d, 0xd192e819ul + (w12 += sigma1(w10) + w5 + sigma0(w13)));
    Round(d, e, f, g, h, a, b, c, 0xd6990624ul + (w13 += sigma1(w11) + w6 + sigma0(w14)));
    Round(c, d, e, f, g, h, a, b, 0xf40e3585ul + (w14 += sigma1(w12) + w7 + sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, 0x106aa070ul + (w15 += sigma1(w13) + w8 + sigma0(w0)));
    Round(a, b, c, d, e, f, g, h, 0x19a4c116ul + (w0 += sigma1(w14) + w9 + sigma0(w1)));
    Round(h, a, b, c, d, e, f, g, 0x1e376c08ul + (w1 += sigma1(w15) + w10 + sigma0(w2)));
    Round(g, h, a, b, c, d, e, f, 0x2748774cul + (w2 += sigma1(w0) + w11 + sigma0(w3)));
    Round(f, g, h, a, b, c, d, e, 0x34b0bcb5ul + (w3 += sigma1(w1) + w12 + sigma0(w4)));
    Round(e, f, g, h, a, b, c, d, 0x391c0cb3ul + (w4 += sigma1(w2) + w13 + sigma0(w5)));
    Round(d, e, f, g, h, a, b, c, 0x4ed8aa4aul + (w5 += sigma1(w3) + w14 + sigma0(w6)));
    Round(c, d, e, f, g, h, a, b, 0x5b9cca4ful + (w6 += sigma1(w4) + w15 + sigma0(w7)));
    Round(b, c, d, e, f, g, h, a, 0x682e6ff3ul + (w7 += sigma1(w5) + w0 + sigma0(w8)));
    Round(a, b, c, d, e, f, g, h, 0x748f82eeul + (w8 += sigma1(w6) + w1 + sigma0(w9)));
    Round(h, a, b, c, d, e, f, g, 0x78a5636ful + (w9 += sigma1(w7) + w2 + sigma0(w10)));
    Round(g, h, a, b, c, d, e, f, 0x84c87814ul + (w10 += sigma1(w8) + w3 + sigma0(w11)));
    Round(f, g, h, a, b, c, d, e, 0x8cc70208ul + (w11 += sigma1(w9) + w4 + sigma0(w12)));
    Round(e, f, g, h, a, b, c, d, 0x90befffaul + (w12 += sigma1(w10) + w5 + sigma0(w13)));
    Round(d, e, f, g, h, a, b, c, 0xa4506cebul + (w13 += sigma1(w11) + w6 + sigma0(w14)));
    Round(c, d, e, f, g, h, a, b, 0xbef9a3f7ul + (w14 + sigma1(w12) + w7 + sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, 0xc67178f2ul + (w15 + sigma1(w13) + w8 + sigma0(w0)));

    a += 0x6a09e667ul;
    b += 0xbb67ae85ul;
    c += 0x3c6ef372ul;
    d += 0xa54ff53aul;
    e += 0x510e527ful;
    f += 0x9b05688cul;
    g += 0x1f83d9abul;
    h += 0x5be0cd19ul;

    uint32_t t0 = a, t1 = b, t2 = c, t3 = d, t4 = e, t5 = f, t6 = g, t7 = h;

    // Transform 2
    Round(a, b, c, d, e, f, g, h, 0xc28a2f98ul);
    Round(h, a, b, c, d, e, f, g, 0x71374491ul);
    Round(g, h, a, b, c, d, e, f, 0xb5c0fbcful);
    Round(f, g, h, a, b, c, d, e, 0xe9b5dba5ul);
    Round(e, f, g, h, a, b, c, d, 0x3956c25bul);
    Round(d, e, f, g, h, a, b, c, 0x59f111f1ul);
    Round(c, d, e, f, g, h, a, b, 0x923f82a4ul);
    Round(b, c, d, e, f, g, h, a, 0xab1c5ed5ul);
    Round(a, b, c, d, e, f, g, h, 0xd807aa98ul);
    Round(h, a, b, c, d, e, f, g, 0x12835b01ul);
    Round(g, h, a, b, c, d, e, f, 0x243185beul);
    Round(f, g, h, a, b, c, d, e, 0x550c7dc3ul);
    Round(e, f, g, h, a, b, c, d, 0x72be5d74ul);
    Round(d, e, f, g, h, a, b, c, 0x80deb1feul);
    Round(c, d, e, f, g, h, a, b, 0x9bdc06a7ul);
    Round(b, c, d, e, f, g, h, a, 0xc19bf374ul);
    Round(a, b, c, d, e, f, g, h, 0x649b69c1ul);
    Round(h, a, b, c, d, e, f, g, 0xf0fe4786ul);
    Round(g, h, a, b, c, d, e, f, 0x0fe1edc6ul);
    Round(f, g, h, a, b, c, d, e, 0x240cf254ul);
    Round(e, f, g, h, a, b, c, d, 0x4fe9346ful);
    Round(d, e, f, g, h, a, b, c, 0x6cc984beul);
    Round(c, d, e, f, g, h, a, b, 0x61b9411eul);
    Round(b, c, d, e, f, g, h, a, 0x16f988faul);
    Round(a, b, c, d, e, f, g, h, 0xf2c65152ul);
    Round(h, a, b, c, d, e, f, g, 0xa88e5a6dul);
    Round(g, h, a, b, c, d, e, f, 0xb019fc65ul);
    Round(f, g, h, a, b, c, d, e, 0xb9d99ec7ul);
    Round(e, f, g, h, a, b, c, d, 0x9a1231c3ul);
    Round(d, e, f, g, h, a, b, c, 0xe70eeaa0ul);
    Round(c, d, e, f, g, h, a, b, 0xfdb1232bul);
    Round(b, c, d, e, f, g, h, a, 0xc7353eb0ul);
    Round(a, b, c, d, e, f, g, h, 0x3069bad5ul);
    Round(h, a, b, c, d, e, f, g, 0xcb976d5ful);
    Round(g, h, a, b, c, d, e, f, 0x5a0f118ful);
    Round(f, g, h, a, b, c, d, e, 0xdc1eeefdul);
    Round(e, f, g, h, a, b, c, d, 0x0a35b689ul);
    Round(d, e, f, g, h, a, b, c, 0xde0b7a04ul);
    Round(c, d, e, f, g, h, a, b, 0x58f4ca9dul);
    Round(b, c, d, e, f, g, h, a, 0xe15d5b16ul);
    Round(a, b, c, d, e, f, g, h, 0x007f3e86ul);
    Round(h, a, b, c, d, e, f, g, 0x37088980ul);
    Round(g, h, a, b, c, d, e, f, 0xa507ea32ul);
    Round(f, g, h, a, b, c, d, e, 0x6fab9537ul);
    Round(e, f, g, h, a, b, c, d, 0x17406110ul);
    Round(d, e, f, g, h, a, b, c, 0x0d8cd6f1ul);
    Round(c, d, e, f, g, h, a, b, 0xcdaa3b6dul);
    Round(b, c, d, e, f, g, h, a, 0xc0bbbe37ul);
    Round(a, b, c, d, e, f, g, h, 0x83613bdaul);
    Round(h, a, b, c, d, e, f, g, 0xdb48a363ul);
    Round(g, h, a, b, c, d, e, f, 0x0b02e931ul);
    Round(f, g, h, a, b, c, d, e, 0x6fd15ca7ul);
    Round(e, f, g, h, a, b, c, d, 0x521afacaul);
    Round(d, e, f, g, h, a, b, c, 0x31338431ul);
    Round(c, d, e, f, g, h, a, b, 0x6ed41a95ul);
    Round(b, c, d, e, f, g, h, a, 0x6d437890ul);
    Round(a, b, c, d, e, f, g, h, 0xc39c91f2ul);
    Round(h, a, b, c, d, e, f, g, 0x9eccabbdul);
    Round(g, h, a, b, c, d, e, f, 0xb5c9a0e6ul);
    Round(f, g, h, a, b, c, d, e, 0x532fb63cul);
    Round(e, f, g, h, a, b, c, d, 0xd2c741c6ul);
    Round(d, e, f, g, h, a, b, c, 0x07237ea3ul);
    Round(c, d, e, f, g, h, a, b, 0xa4954b68ul);
    Round(b, c, d, e, f, g, h, a, 0x4c191d76ul);

    w0 = t0 + a;
    w1 = t1 + b;
    w2 = t2 + c;
    w3 = t3 + d;
    w4 = t4 + e;
    w5 = t5 + f;
    w6 = t6 + g;
    w7 = t7 + h;

    // Transform 3
    a = 0x6a09e667ul;
    b = 0xbb67ae85ul;
    c = 0x3c6ef372ul;
    d = 0xa54ff53aul;
    e = 0x510e527ful;
    f = 0x9b05688cul;
    g = 0x1f83d9abul;
    h = 0x5be0cd19ul;

    Round(a, b, c, d, e, f, g, h, 0x428a2f98ul + w0);
    Round(h, a, b, c, d, e, f, g, 0x71374491ul + w1);
    Round(g, h, a, b, c, d, e, f, 0xb5c0fbcful + w2);
    Round(f, g, h, a, b, c, d, e, 0xe9b5dba5ul + w3);
    Round(e, f, g, h, a, b, c, d, 0x3956c25bul + w4);
    Round(d, e, f, g, h, a, b, c, 0x59f111f1ul + w5);
    Round(c, d, e, f, g, h, a, b, 0x923f82a4ul + w6);
    Round(b, c, d, e, f, g, h, a, 0xab1c5ed5ul + w7);
    Round(a, b, c, d, e, f, g, h, 0x5807aa98ul);
    Round(h, a, b, c, d, e, f, g, 0x12835b01ul);
    Round(g, h, a, b, c, d, e, f, 0x243185beul);
    Round(f, g, h, a, b, c, d, e, 0x550c7dc3ul);
    Round(e, f, g, h, a, b, c, d, 0x72be5d74ul);
    Round(d, e, f, g, h, a, b, c, 0x80deb1feul);
    Round(c, d, e, f, g, h, a, b, 0x9bdc06a7ul);
    Round(b, c, d, e, f, g, h, a, 0xc19bf274ul);
    Round(a, b, c, d, e, f, g, h, 0xe49b69c1ul + (w0 += sigma0(w1)));
    Round(h, a, b, c, d, e, f, g, 0xefbe4786ul + (w1 += 0xa00000ul + sigma0(w2)));
    Round(g, h, a, b, c, d, e, f, 0x0fc19dc6ul + (w2 += sigma1(w0) + sigma0(w3)));
    Round(f, g, h, a, b, c, d, e, 0x240ca1ccul + (w3 += sigma1(w1) + sigma0(w4)));
    Round(e, f, g, h, a, b, c, d, 0x2de92c6ful + (w4 += sigma1(w2) + sigma0(w5)));
    Round(d, e, f, g, h, a, b, c, 0x4a7484aaul + (w5 += sigma1(w3) + sigma0(w6)));
    Round(c, d, e, f, g, h, a, b, 0x5cb0a9dcul + (w6 += sigma1(w4) + 0x100ul + sigma0(w7)));
    Round(b, c, d, e, f, g, h, a, 0x76f988daul + (w7 += sigma1(w5) + w0 + 0x11002000ul));
    Round(a, b, c, d, e, f, g, h, 0x983e5152ul + (w8 = 0x80000000ul + sigma1(w6) + w1));
    Round(h, a, b, c, d, e, f, g, 0xa831c66dul + (w9 = sigma1(w7) + w2));
    Round(g, h, a, b, c, d, e, f, 0xb00327c8ul + (w10 = sigma1(w8) + w3));
    Round(f, g, h, a, b, c, d, e, 0xbf597fc7ul + (w11 = sigma1(w9) + w4));
    Round(e, f, g, h, a, b, c, d, 0xc6e00bf3ul + (w12 = sigma1(w10) + w5));
    Round(d, e, f, g, h, a, b, c, 0xd5a79147ul + (w13 = sigma1(w11) + w6));
    Round(c, d, e, f, g, h, a, b, 0x06ca6351ul + (w14 = sigma1(w12) + w7 + 0x400022ul));
    Round(b, c, d, e, f, g, h, a, 0x14292967ul + (w15 = 0x100ul + sigma1(w13) + w8 + sigma0(w0)));
    Round(a, b, c, d, e, f, g, h, 0x27b70a85ul + (w0 += sigma1(w14) + w9 + sigma0(w1)));
    Round(h, a, b, c, d, e, f, g, 0x2e1b2138ul + (w1 += sigma1(w15) + w10 + sigma0(w2)));
    Round(g, h, a, b, c, d, e, f, 0x4d2c6dfcul + (w2 += sigma1(w0) + w11 + sigma0(w3)));
    Round(f, g, h, a, b, c, d, e, 0x53380d13ul + (w3 += sigma1(w1) + w12 + sigma0(w4)));
    Round(e, f, g, h, a, b, c, d, 0x650a7354ul + (w4 += sigma1(w2) + w13 + sigma0(w5)));
    Round(d, e, f, g, h, a, b, c, 0x766a0abbul + (w5 += sigma1(w3) + w14 + sigma0(w6)));
    Round(c, d, e, f, g, h, a, b, 0x81c2c92eul + (w6 += sigma1(w4) + w15 + sigma0(w7)));
    Round(b, c, d, e, f, g, h, a, 0x92722c85ul + (w7 += sigma1(w5) + w0 + sigma0(w8)));
    Round(a, b, c, d, e, f, g, h, 0xa2bfe8a1ul + (w8 += sigma1(w6) + w1 + sigma0(w9)));
    Round(h, a, b, c, d, e, f, g, 0xa81a664bul + (w9 += sigma1(w7) + w2 + sigma0(w10)));
    Round(g, h, a, b, c, d, e, f, 0xc24b8b70ul + (w10 += sigma1(w8) + w3 + sigma0(w11)));
    Round(f, g, h, a, b, c, d, e, 0xc76c51a3ul + (w11 += sigma1(w9) + w4 + sigma0(w12)));
    Round(e, f, g, h, a, b, c, d, 0xd192e819ul + (w12 += sigma1(w10) + w5 + sigma0(w13)));
    Round(d, e, f, g, h, a, b, c, 0xd6990624ul + (w13 += sigma1(w11) + w6 + sigma0(w14)));
    Round(c, d, e, f, g, h, a, b, 0xf40e3585ul + (w14 += sigma1(w12) + w7 + sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, 0x106aa070ul + (w15 += sigma1(w13) + w8 + sigma0(w0)));
    Round(a, b, c, d, e, f, g, h, 0x19a4c116ul + (w0 += sigma1(w14) + w9 + sigma0(w1)));
    Round(h, a, b, c, d, e, f, g, 0x1e376c08ul + (w1 += sigma1(w15) + w10 + sigma0(w2)));
    Round(g, h, a, b, c, d, e, f, 0x2748774cul + (w2 += sigma1(w0) + w11 + sigma0(w3)));
    Round(f, g, h, a, b, c, d, e, 0x34b0bcb5ul + (w3 += sigma1(w1) + w12 + sigma0(w4)));
    Round(e, f, g, h, a, b, c, d, 0x391c0cb3ul + (w4 += sigma1(w2) + w13 + sigma0(w5)));
    Round(d, e, f, g, h, a, b, c, 0x4ed8aa4aul + (w5 += sigma1(w3) + w14 + sigma0(w6)));
    Round(c, d, e, f, g, h, a, b, 0x5b9cca4ful + (w6 += sigma1(w4) + w15 + sigma0(w7)));
    Round(b, c, d, e, f, g, h, a, 0x682e6ff3ul + (w7 += sigma1(w5) + w0 + sigma0(w8)));
    Round(a, b, c, d, e, f, g, h, 0x748f82eeul + (w8 += sigma1(w6) + w1 + sigma0(w9)));
    Round(h, a, b, c, d, e, f, g, 0x78a5636ful + (w9 += sigma1(w7) + w2 + sigma0(w10)));
    Round(g, h, a, b, c, d, e, f, 0x84c87814ul + (w10 += sigma1(w8) + w3 + sigma0(w11)));
    Round(f, g, h, a, b, c, d, e, 0x8cc70208ul + (w11 += sigma1(w9) + w4 + sigma0(w12)));
    Round(e, f, g, h, a, b, c, d, 0x90befffaul + (w12 += sigma1(w10) + w5 + sigma0(w13)));
    Round(d, e, f, g, h, a, b, c, 0xa4506cebul + (w13 += sigma1(w11) + w6 + sigma0(w14)));
    Round(c, d, e, f, g, h, a, b, 0xbef9a3f7ul + (w14 + sigma1(w12) + w7 + sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, 0xc67178f2ul + (w15 + sigma1(w13) + w8 + sigma0(w0)));

    // Output
    WriteBE32(out + 0, a + 0x6a09e667ul);
    WriteBE32(out + 4, b + 0xbb67ae85ul);
    WriteBE32(out + 8, c + 0x3c6ef372ul);
    WriteBE32(out + 12, d + 0xa54ff53aul);
    WriteBE32(out + 16, e + 0x510e527ful);
    WriteBE32(out + 20, f + 0x9b05688cul);
    WriteBE32(out + 24, g + 0x1f83d9abul);
    WriteBE32(out + 28, h + 0x5be0cd19ul);
}